

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<capnp::_::ConstData<3ul>const&>
          (String *__return_storage_ptr__,kj *this,ConstData<3UL> *params)

{
  undefined8 local_48;
  undefined8 local_40;
  char *local_38;
  undefined8 local_30;
  Array<kj::CappedArray<char,_5UL>_> local_28;
  
  local_48 = *(undefined8 *)this;
  local_40 = 3;
  local_38 = ", ";
  local_30 = 3;
  local_28.ptr = (CappedArray<char,_5UL> *)0x0;
  local_28.size_ = 0;
  local_28.disposer = (ArrayDisposer *)0x0;
  _::concat<kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>>
            (__return_storage_ptr__,(_ *)&local_48,
             (Delimited<kj::ArrayPtr<const_unsigned_char>_> *)params);
  Array<kj::CappedArray<char,_5UL>_>::~Array(&local_28);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}